

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
Shell::Options::getSimilarOptionNames(Options *this,string *name,bool is_short)

{
  undefined1 uVar1;
  AbstractOptionValue *elem;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  byte in_CL;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI;
  string *in_stack_00000030;
  string *in_stack_00000038;
  size_t dif;
  string opt_name;
  AbstractOptionValue *opt;
  VirtualIterator<Shell::Options::AbstractOptionValue_*> options;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *similar_names;
  LookupWrapper *in_stack_ffffffffffffff38;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  string local_88 [32];
  ulong local_68;
  string local_60 [32];
  AbstractOptionValue *local_40;
  byte local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Stack((Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
  LookupWrapper::values(in_stack_ffffffffffffff38);
  while( true ) {
    uVar1 = Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::hasNext
                      ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0xc34b6d);
    if (!(bool)uVar1) break;
    elem = Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::next
                     ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0xc34b8d);
    if ((local_19 & 1) == 0) {
      in_stack_ffffffffffffff40 =
           (Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&elem->longName;
    }
    else {
      in_stack_ffffffffffffff40 =
           (Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&elem->shortName;
    }
    local_40 = elem;
    std::__cxx11::string::string(local_60,(string *)in_stack_ffffffffffffff40);
    local_68 = 2;
    if ((local_19 & 1) == 0) {
      uVar2 = std::__cxx11::string::size();
      local_68 = (uVar2 >> 2) + local_68;
    }
    lVar3 = std::__cxx11::string::size();
    if (lVar3 != 0) {
      sVar4 = Lib::StringUtils::distance(in_stack_00000038,in_stack_00000030);
      if (sVar4 < local_68) {
        std::__cxx11::string::string(local_88,local_60);
        Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push((Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(uVar1,in_stack_ffffffffffffff50),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)elem);
        std::__cxx11::string::~string(local_88);
      }
    }
    std::__cxx11::string::~string(local_60);
  }
  local_1a = 1;
  Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::~VirtualIterator
            ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)in_stack_ffffffffffffff40);
  if ((local_1a & 1) == 0) {
    Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Stack(in_stack_ffffffffffffff40);
  }
  return in_RDI;
}

Assistant:

Stack<std::string> Options::getSimilarOptionNames(std::string name, bool is_short) const {

  Stack<std::string> similar_names;

  VirtualIterator<AbstractOptionValue*> options = _lookup.values();
  while(options.hasNext()){
    AbstractOptionValue* opt = options.next();
    std::string opt_name = is_short ? opt->shortName : opt->longName;
    size_t dif = 2;
    if(!is_short) dif += name.size()/4;
    if(name.size()!=0 && StringUtils::distance(name,opt_name) < dif)
      similar_names.push(opt_name);
  }

  return similar_names;
}